

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

upb_MutableMessageValue upb_Array_GetMutable(upb_Array *arr,size_t i)

{
  size_t sVar1;
  void *pvVar2;
  int lg2;
  char *data;
  size_t i_local;
  upb_Array *arr_local;
  upb_MutableMessageValue ret;
  
  sVar1 = upb_Array_Size(arr);
  if (i < sVar1) {
    pvVar2 = upb_Array_MutableDataPtr(arr);
    sVar1 = _upb_Array_ElemSizeLg2_dont_copy_me__upb_internal_use_only(arr);
    memcpy(&arr_local,(void *)((long)pvVar2 + (i << ((byte)sVar1 & 0x3f))),
           (long)(1 << ((byte)sVar1 & 0x1f)));
    return (upb_MutableMessageValue)arr_local;
  }
  __assert_fail("i < upb_Array_Size(arr)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/array.c"
                ,0x27,"upb_MutableMessageValue upb_Array_GetMutable(upb_Array *, size_t)");
}

Assistant:

upb_MutableMessageValue upb_Array_GetMutable(upb_Array* arr, size_t i) {
  UPB_ASSERT(i < upb_Array_Size(arr));
  upb_MutableMessageValue ret;
  char* data = upb_Array_MutableDataPtr(arr);
  const int lg2 = UPB_PRIVATE(_upb_Array_ElemSizeLg2)(arr);
  memcpy(&ret, data + (i << lg2), 1 << lg2);
  return ret;
}